

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalToStackPass.cpp
# Opt level: O0

Function * getUsingFunction(Value *V)

{
  bool bVar1;
  size_type sVar2;
  ret_type this;
  User *Elt;
  ret_type this_00;
  BasicBlock *pBVar3;
  Function *pFVar4;
  iterator_range<llvm::Value::user_iterator_impl<llvm::User>_> iVar5;
  Instruction *I;
  User *UU;
  user_iterator_impl<llvm::User> __end3;
  user_iterator_impl<llvm::User> __begin3;
  iterator_range<llvm::Value::user_iterator_impl<llvm::User>_> *__range3;
  pair<llvm::SmallPtrSetIterator<llvm::User_*>,_bool> local_f0;
  User *local_d8;
  User *U_1;
  User *U;
  user_iterator_impl<llvm::User> __end1;
  user_iterator_impl<llvm::User> __begin1;
  iterator_range<llvm::Value::user_iterator_impl<llvm::User>_> *__range1;
  undefined1 local_90 [8];
  SmallSet<llvm::User_*,_4U,_std::less<llvm::User_*>_> Visited;
  SmallVector<llvm::User_*,_4U> Worklist;
  Function *F;
  Value *V_local;
  
  Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts[0x18] = '\0';
  Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts[0x19] = '\0';
  Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts[0x1a] = '\0';
  Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts[0x1b] = '\0';
  Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts[0x1c] = '\0';
  Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts[0x1d] = '\0';
  Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts[0x1e] = '\0';
  Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts[0x1f] = '\0';
  llvm::SmallVector<llvm::User_*,_4U>::SmallVector
            ((SmallVector<llvm::User_*,_4U> *)
             (Visited.super_SmallPtrSet<llvm::User_*,_4U>.SmallStorage + 3));
  llvm::SmallSet<llvm::User_*,_4U,_std::less<llvm::User_*>_>::SmallSet
            ((SmallSet<llvm::User_*,_4U,_std::less<llvm::User_*>_> *)local_90);
  iVar5 = llvm::Value::users(V);
  __begin1 = iVar5.begin_iterator.UI.U;
  __end1 = llvm::iterator_range<llvm::Value::user_iterator_impl<llvm::User>_>::begin
                     ((iterator_range<llvm::Value::user_iterator_impl<llvm::User>_> *)&__begin1);
  U = (User *)llvm::iterator_range<llvm::Value::user_iterator_impl<llvm::User>_>::end
                        ((iterator_range<llvm::Value::user_iterator_impl<llvm::User>_> *)&__begin1);
  while (bVar1 = llvm::Value::user_iterator_impl<llvm::User>::operator!=
                           (&__end1,(user_iterator_impl<llvm::User> *)&U), bVar1) {
    U_1 = llvm::Value::user_iterator_impl<llvm::User>::operator*(&__end1);
    llvm::SmallVectorTemplateBase<llvm::User_*,_true>::push_back
              ((SmallVectorTemplateBase<llvm::User_*,_true> *)
               (Visited.super_SmallPtrSet<llvm::User_*,_4U>.SmallStorage + 3),U_1);
    llvm::Value::user_iterator_impl<llvm::User>::operator++(&__end1);
  }
  do {
    while( true ) {
      do {
        bVar1 = llvm::SmallVectorBase<unsigned_int>::empty
                          ((SmallVectorBase<unsigned_int> *)
                           (Visited.super_SmallPtrSet<llvm::User_*,_4U>.SmallStorage + 3));
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          V_local = (Value *)Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts._24_8_;
          goto LAB_00176bfc;
        }
        local_d8 = llvm::SmallVectorImpl<llvm::User_*>::pop_back_val
                             ((SmallVectorImpl<llvm::User_*> *)
                              (Visited.super_SmallPtrSet<llvm::User_*,_4U>.SmallStorage + 3));
        sVar2 = llvm::SmallPtrSetImpl<llvm::User_*>::count
                          ((SmallPtrSetImpl<llvm::User_*> *)local_90,local_d8);
      } while (sVar2 != 0);
      llvm::SmallPtrSetImpl<llvm::User_*>::insert
                (&local_f0,(SmallPtrSetImpl<llvm::User_*> *)local_90,local_d8);
      bVar1 = llvm::isa<llvm::ConstantExpr,llvm::User*>(&local_d8);
      if (((!bVar1) && (bVar1 = llvm::isa<llvm::ConstantAggregate,llvm::User*>(&local_d8), !bVar1))
         && (bVar1 = llvm::isa<llvm::GlobalVariable,llvm::User*>(&local_d8), !bVar1)) break;
      bVar1 = llvm::isa<llvm::GlobalVariable,llvm::User*>(&local_d8);
      if (bVar1) {
        this = llvm::cast<llvm::GlobalVariable,llvm::User>(local_d8);
        bVar1 = llvm::GlobalValue::isDiscardableIfUnused((GlobalValue *)this);
        if (!bVar1) {
          V_local = (Value *)0x0;
          goto LAB_00176bfc;
        }
      }
      iVar5 = llvm::Value::users((Value *)local_d8);
      __begin3 = iVar5.begin_iterator.UI.U;
      __end3 = llvm::iterator_range<llvm::Value::user_iterator_impl<llvm::User>_>::begin
                         ((iterator_range<llvm::Value::user_iterator_impl<llvm::User>_> *)&__begin3)
      ;
      UU = (User *)llvm::iterator_range<llvm::Value::user_iterator_impl<llvm::User>_>::end
                             ((iterator_range<llvm::Value::user_iterator_impl<llvm::User>_> *)
                              &__begin3);
      while (bVar1 = llvm::Value::user_iterator_impl<llvm::User>::operator!=
                               (&__end3,(user_iterator_impl<llvm::User> *)&UU), bVar1) {
        Elt = llvm::Value::user_iterator_impl<llvm::User>::operator*(&__end3);
        llvm::SmallVectorTemplateBase<llvm::User_*,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::User_*,_true> *)
                   (Visited.super_SmallPtrSet<llvm::User_*,_4U>.SmallStorage + 3),Elt);
        llvm::Value::user_iterator_impl<llvm::User>::operator++(&__end3);
      }
    }
    this_00 = llvm::dyn_cast<llvm::Instruction,llvm::User>(local_d8);
    if (this_00 == (ret_type)0x0) {
      V_local = (Value *)0x0;
      goto LAB_00176bfc;
    }
    if (Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts._24_8_ == 0) {
      pBVar3 = llvm::Instruction::getParent(this_00);
      Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts._24_8_ =
           llvm::BasicBlock::getParent(pBVar3);
    }
    pBVar3 = llvm::Instruction::getParent(this_00);
    pFVar4 = llvm::BasicBlock::getParent(pBVar3);
  } while (pFVar4 == (Function *)
                     Worklist.super_SmallVectorStorage<llvm::User_*,_4U>.InlineElts._24_8_);
  V_local = (Value *)0x0;
LAB_00176bfc:
  llvm::SmallSet<llvm::User_*,_4U,_std::less<llvm::User_*>_>::~SmallSet
            ((SmallSet<llvm::User_*,_4U,_std::less<llvm::User_*>_> *)local_90);
  llvm::SmallVector<llvm::User_*,_4U>::~SmallVector
            ((SmallVector<llvm::User_*,_4U> *)
             (Visited.super_SmallPtrSet<llvm::User_*,_4U>.SmallStorage + 3));
  return (Function *)V_local;
}

Assistant:

static Function *getUsingFunction(Value &V) {
  Function *F = nullptr;

  SmallVector<User *, 4> Worklist;
  SmallSet<User *, 4> Visited;

  for (auto *U : V.users())
    Worklist.push_back(U);
  while (!Worklist.empty()) {
    auto *U = Worklist.pop_back_val();

    if (Visited.count(U))
      continue;
    else
      Visited.insert(U);

    if (isa<ConstantExpr>(U) || isa<ConstantAggregate>(U) ||
        isa<GlobalVariable>(U)) {
      if (isa<GlobalVariable>(U) &&
          !cast<GlobalVariable>(U)->isDiscardableIfUnused())
        return nullptr;
      for (auto *UU : U->users()) {
        Worklist.push_back(UU);
      }
      continue;
    }

    auto *I = dyn_cast<Instruction>(U);
    if (!I)
      return nullptr;
    if (!F)
      F = I->getParent()->getParent();
    if (I->getParent()->getParent() != F)
      return nullptr;
  }

  return F;
}